

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableDirectory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::asDirectory
          (InMemoryDirectory *this,
          Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,EntryImpl *entry)

{
  bool bVar1;
  Own<const_kj::Directory> *this_00;
  Directory *__fn;
  SymlinkNode *this_01;
  int __flags;
  long in_RCX;
  void *__child_stack;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  ReadableDirectory *pRVar2;
  void *in_R8;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> MVar3;
  PathPtr path;
  Fault local_78;
  Fault f;
  undefined1 local_60 [8];
  Path newPath;
  Own<const_kj::Directory> local_38;
  long local_28;
  EntryImpl *entry_local;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock_local;
  InMemoryDirectory *this_local;
  
  local_28 = in_RCX;
  entry_local = entry;
  lock_local = lock;
  this_local = this;
  bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::is<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                    ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      *)(in_RCX + 0x18));
  __flags = (int)in_RCX;
  if (bVar1) {
    this_00 = &OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               ::get<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                         ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                           *)(local_28 + 0x18))->directory;
    __fn = Own<const_kj::Directory>::operator->(this_00);
    Directory::clone((Directory *)&local_38,(__fn *)__fn,__child_stack,__flags,in_R8);
    Maybe<kj::Own<kj::ReadableDirectory_const>>::Maybe<kj::Directory_const>
              ((Maybe<kj::Own<kj::ReadableDirectory_const>> *)this,&local_38);
    Own<const_kj::Directory>::~Own(&local_38);
    pRVar2 = extraout_RDX;
  }
  else {
    bVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::is<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                      ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                        *)(local_28 + 0x18));
    if (bVar1) {
      this_01 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                ::get<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                          ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                            *)(local_28 + 0x18));
      SymlinkNode::parse((Path *)local_60,this_01);
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry_local);
      PathPtr::PathPtr((PathPtr *)&f,(Path *)local_60);
      path.parts.size_ = (size_t)f.exception;
      path.parts.ptr = (String *)lock;
      tryOpenSubdir(this,path);
      Path::~Path((Path *)local_60);
      pRVar2 = extraout_RDX_00;
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x64b,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x642e05);
      Maybe<kj::Own<const_kj::ReadableDirectory>_>::Maybe
                ((Maybe<kj::Own<const_kj::ReadableDirectory>_> *)this,(void *)0x0);
      _::Debug::Fault::~Fault(&local_78);
      pRVar2 = extraout_RDX_01;
    }
  }
  MVar3.ptr.ptr = pRVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> asDirectory(
      kj::Locked<const Impl>& lock, const EntryImpl& entry) const {
    if (entry.node.is<DirectoryNode>()) {
      return entry.node.get<DirectoryNode>().directory->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenSubdir(newPath);
    } else {
      KJ_FAIL_REQUIRE("not a directory") { return nullptr; }
    }
  }